

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_cwksp *ws;
  ZSTD_paramSwitch_e ZVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  void *pvVar4;
  ZSTD_allocFunction p_Var5;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ZSTD_freeFunction p_Var13;
  ldmParams_t params_01;
  ZSTD_customMem customMem;
  ZSTD_compressionParameters cParams_00;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [12];
  uint uVar21;
  uint uVar22;
  ZSTD_strategy ZVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  size_t sVar30;
  size_t __size;
  size_t sVar31;
  seqDef *psVar32;
  ldmEntry_t *__s;
  rawSeq *prVar33;
  ZSTD_Sequence *pZVar34;
  BYTE *pBVar35;
  void *pvVar36;
  ZSTD_compressedBlockState_t *pZVar37;
  U32 *pUVar38;
  ZSTD_indexResetPolicy_e forceResetIndex;
  U64 UVar39;
  size_t err_code;
  size_t local_88;
  size_t local_78;
  undefined4 local_5c;
  undefined4 uStack_58;
  
  uVar8 = (params->cParams).searchLog;
  uVar17 = (params->cParams).windowLog;
  uVar18 = (params->cParams).chainLog;
  uVar19 = (params->cParams).hashLog;
  cParams_00.hashLog = uVar19;
  cParams_00.chainLog = uVar18;
  cParams_00.windowLog = uVar17;
  uVar9 = (params->cParams).minMatch;
  uVar10 = (params->cParams).targetLength;
  uVar11 = (params->cParams).strategy;
  cParams_00.searchLog = uVar8;
  cParams_00.minMatch = uVar9;
  cParams_00.targetLength = uVar10;
  cParams_00.strategy = uVar11;
  sVar28 = ZSTD_checkCParams(cParams_00);
  if (0xffffffffffffff88 < sVar28) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x806,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xd0);
  if ((zc->appliedParams).useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x810,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).useBlockSplitter == ZSTD_ps_auto) {
    __assert_fail("params->useBlockSplitter != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x811,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  ZVar2 = (zc->appliedParams).ldmParams.enableLdm;
  if (ZVar2 == ZSTD_ps_auto) {
    __assert_fail("params->ldmParams.enableLdm != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x812,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  sVar28 = (zc->appliedParams).maxBlockSize;
  if (sVar28 == 0) {
    __assert_fail("params->maxBlockSize != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x813,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  params_00 = &(zc->appliedParams).ldmParams;
  if (ZVar2 == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
    if ((zc->appliedParams).ldmParams.hashLog < (zc->appliedParams).ldmParams.bucketSizeLog) {
      __assert_fail("params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x817,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < (zc->appliedParams).ldmParams.hashRateLog) {
      __assert_fail("params->ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x818,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    sVar28 = (zc->appliedParams).maxBlockSize;
  }
  UVar39 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= UVar39) {
    UVar39 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    UVar39 = 1;
  }
  if (UVar39 <= sVar28) {
    sVar28 = UVar39;
  }
  local_88 = 0;
  uVar29 = sVar28 / (4 - (ulong)((zc->appliedParams).useSequenceProducer != 0 ||
                                (zc->appliedParams).cParams.minMatch == 3));
  local_78 = 0;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      local_88 = ZSTD_compressBound(sVar28);
      local_88 = local_88 + 1;
    }
    else {
      local_88 = 0;
    }
    local_78 = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      local_78 = UVar39 + sVar28;
    }
  }
  cParams = &(zc->appliedParams).cParams;
  uVar3 = (zc->appliedParams).ldmParams.hashRateLog;
  uVar6 = (zc->appliedParams).ldmParams.windowLog;
  uVar12 = (zc->appliedParams).ldmParams.minMatchLength;
  uVar14 = params_00->enableLdm;
  uVar15 = params_00->hashLog;
  uVar16 = params_00->bucketSizeLog;
  params_01.bucketSizeLog = uVar16;
  params_01.hashLog = uVar15;
  params_01.enableLdm = uVar14;
  params_01.minMatchLength = uVar12;
  params_01.hashRateLog = uVar3;
  params_01.windowLog = uVar6;
  sVar30 = ZSTD_ldm_getMaxNbSeq(params_01,sVar28);
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  __size = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,local_78,local_88,pledgedSrcSize,
                      (zc->appliedParams).useSequenceProducer,(zc->appliedParams).maxBlockSize);
  if (0xffffffffffffff88 < __size) {
    return __size;
  }
  sVar31 = zc->staticSize;
  if (sVar31 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar36 = (zc->workspace).workspace;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < __size * 3) {
    bVar7 = false;
  }
  else {
    bVar7 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  ws = &zc->workspace;
  if (((ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar36) < __size) || (bVar7)) {
    if (sVar31 != 0) {
      return 0xffffffffffffffc0;
    }
    pvVar4 = (zc->customMem).opaque;
    p_Var13 = (zc->customMem).customFree;
    auVar20 = *(undefined1 (*) [12])&zc->customMem;
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    customMem.customFree._4_4_ = (int)((ulong)p_Var13 >> 0x20);
    customMem._0_12_ = auVar20;
    customMem.opaque._0_4_ = (int)pvVar4;
    customMem.opaque._4_4_ = (int)((ulong)pvVar4 >> 0x20);
    ZSTD_customFree(pvVar36,customMem);
    p_Var5 = (zc->customMem).customAlloc;
    if (p_Var5 == (ZSTD_allocFunction)0x0) {
      pvVar36 = malloc(__size);
    }
    else {
      pvVar36 = (*p_Var5)((zc->customMem).opaque,__size);
    }
    if (pvVar36 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_cwksp_init(ws,pvVar36,__size,ZSTD_cwksp_dynamic_alloc);
    if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x2c00) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x84c,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar37 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).prevCBlock = pZVar37;
    if (pZVar37 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar37 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).nextCBlock = pZVar37;
    if (pZVar37 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar38 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
    zc->entropyWorkspace = pUVar38;
    if (pUVar38 == (U32 *)0x0) {
      return 0xffffffffffffffc0;
    }
    forceResetIndex = ZSTDirp_reset;
  }
  ZSTD_cwksp_clear(ws);
  uVar24 = cParams->windowLog;
  uVar25 = cParams->chainLog;
  uVar26 = (zc->appliedParams).cParams.hashLog;
  uVar27 = (zc->appliedParams).cParams.searchLog;
  uVar21 = (zc->appliedParams).cParams.minMatch;
  uVar22 = (zc->appliedParams).cParams.targetLength;
  ZVar23 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar21;
  (zc->blockState).matchState.cParams.targetLength = uVar22;
  (zc->blockState).matchState.cParams.strategy = ZVar23;
  (zc->blockState).matchState.cParams.windowLog = uVar24;
  (zc->blockState).matchState.cParams.chainLog = uVar25;
  (zc->blockState).matchState.cParams.hashLog = uVar26;
  (zc->blockState).matchState.cParams.searchLog = uVar27;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = sVar28;
  ZSTD_XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  sVar31 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,ws,cParams,(zc->appliedParams).useRowMatchFinder,
                      crp,forceResetIndex,ZSTD_resetTarget_CCtx);
  if (sVar31 < 0xffffffffffffff89) {
    psVar32 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,uVar29 * 8);
    (zc->seqStore).sequencesStart = psVar32;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      sVar31 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
      __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,sVar31);
      (zc->ldmState).hashTable = __s;
      memset(__s,0,sVar31);
      prVar33 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,sVar30 * 0xc);
      zc->ldmSequences = prVar33;
      zc->maxNbLdmSequences = sVar30;
      *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
      (zc->ldmState).window.base = " ";
      (zc->ldmState).window.dictBase = " ";
      (zc->ldmState).window.dictLimit = 2;
      (zc->ldmState).window.lowLimit = 2;
      (zc->ldmState).window.nextSrc =
           (BYTE *)
           "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx"
      ;
      (zc->ldmState).loadedDictEnd = 0;
    }
    if ((zc->appliedParams).useSequenceProducer != 0) {
      sVar30 = sVar28 / 3 + 1;
      (zc->externalMatchCtx).seqBufferCapacity = sVar30;
      pZVar34 = (ZSTD_Sequence *)ZSTD_cwksp_reserve_aligned(ws,sVar30 * 0x10);
      (zc->externalMatchCtx).seqBuffer = pZVar34;
    }
    pBVar35 = ZSTD_cwksp_reserve_buffer(ws,sVar28 + 0x20);
    (zc->seqStore).litStart = pBVar35;
    (zc->seqStore).maxNbLit = sVar28;
    zc->bufferedPolicy = zbuff;
    zc->inBuffSize = local_78;
    pBVar35 = ZSTD_cwksp_reserve_buffer(ws,local_78);
    zc->inBuff = (char *)pBVar35;
    zc->outBuffSize = local_88;
    pBVar35 = ZSTD_cwksp_reserve_buffer(ws,local_88);
    zc->outBuff = (char *)pBVar35;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      sVar28 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                      (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
      pBVar35 = ZSTD_cwksp_reserve_buffer(ws,sVar28);
      (zc->ldmState).bucketOffsets = pBVar35;
      memset(pBVar35,0,sVar28);
    }
    ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
    (zc->seqStore).maxNbSeq = uVar29;
    pBVar35 = ZSTD_cwksp_reserve_buffer(ws,uVar29);
    (zc->seqStore).llCode = pBVar35;
    pBVar35 = ZSTD_cwksp_reserve_buffer(ws,uVar29);
    (zc->seqStore).mlCode = pBVar35;
    pBVar35 = ZSTD_cwksp_reserve_buffer(ws,uVar29);
    (zc->seqStore).ofCode = pBVar35;
    uVar29 = ((long)(zc->workspace).tableEnd + (long)(zc->workspace).workspaceEnd) -
             ((long)(zc->workspace).workspace + (long)(zc->workspace).allocStart);
    if ((uVar29 < __size - 0x80) || (__size < uVar29)) {
      __assert_fail("ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x8aa,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    zc->initialized = 1;
    sVar31 = 0;
  }
  return sVar31;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, params->useSequenceProducer);
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, params->useSequenceProducer, params->maxBlockSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (params->useSequenceProducer) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->externalMatchCtx.seqBufferCapacity = maxNbExternalSeq;
            zc->externalMatchCtx.seqBuffer =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}